

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

lua_Integer unpackint(lua_State *L,char *str,int islittle,int size,int issigned)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  char cVar7;
  
  uVar5 = 8;
  if (size < 8) {
    uVar5 = size;
  }
  uVar1 = size - uVar5;
  uVar4 = 0;
  uVar2 = uVar5;
  while (0 < (int)uVar2) {
    uVar2 = uVar2 - 1;
    uVar3 = uVar2;
    if (islittle == 0) {
      uVar3 = uVar1;
    }
    uVar4 = uVar4 << 8 | (ulong)(byte)str[(int)uVar3];
    uVar1 = uVar1 + 1;
  }
  if (size < 8) {
    if (issigned != 0) {
      bVar6 = (char)(size << 3) - 1;
      uVar4 = (uVar4 ^ 1L << ((ulong)bVar6 & 0x3f)) - (1L << (bVar6 & 0x3f));
    }
  }
  else if (size != 8) {
    cVar7 = -1;
    if (-1 < (long)uVar4) {
      cVar7 = '\0';
    }
    if (issigned == 0) {
      cVar7 = '\0';
    }
    for (uVar2 = ~uVar5 + size; uVar2 != 0xffffffff; uVar2 = uVar2 - 1) {
      uVar1 = uVar5;
      if (islittle == 0) {
        uVar1 = uVar2;
      }
      if (cVar7 != str[(int)uVar1]) {
        luaL_error(L,"%d-byte integer does not fit into Lua Integer",(ulong)(uint)size);
      }
      uVar5 = uVar5 + 1;
    }
  }
  return uVar4;
}

Assistant:

static lua_Integer unpackint(lua_State *L, const char *str,
                             int islittle, int size, int issigned) {
    lua_Unsigned res = 0;
    int i;
    int limit = (size <= SZINT) ? size : SZINT;
    for (i = limit - 1; i >= 0; i--) {
        res <<= NB;
        res |= (lua_Unsigned) (unsigned char) str[islittle ? i : size - 1 - i];
    }
    if (size < SZINT) {  /* real size smaller than lua_Integer? */
        if (issigned) {  /* needs sign extension? */
            lua_Unsigned mask = (lua_Unsigned) 1 << (size * NB - 1);
            res = ((res ^ mask) - mask);  /* do sign extension */
        }
    } else if (size > SZINT) {  /* must check unread bytes */
        int mask = (!issigned || (lua_Integer) res >= 0) ? 0 : MC;
        for (i = limit; i < size; i++) {
            if ((unsigned char) str[islittle ? i : size - 1 - i] != mask)
                luaL_error(L, "%d-byte integer does not fit into Lua Integer", size);
        }
    }
    return (lua_Integer) res;
}